

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O3

void save_position(Fl_Window *w,char *prefsName)

{
  uint value;
  Fl_Preferences pos;
  Fl_Preferences FStack_28;
  
  Fl_Preferences::Fl_Preferences(&FStack_28,&fluid_prefs,prefsName);
  Fl_Preferences::set(&FStack_28,"x",(w->super_Fl_Group).super_Fl_Widget.x_);
  Fl_Preferences::set(&FStack_28,"y",(w->super_Fl_Group).super_Fl_Widget.y_);
  Fl_Preferences::set(&FStack_28,"w",(w->super_Fl_Group).super_Fl_Widget.w_);
  Fl_Preferences::set(&FStack_28,"h",(w->super_Fl_Group).super_Fl_Widget.h_);
  if (w->i == (Fl_X *)0x0) {
    value = 0;
  }
  else {
    value = (uint)(((w->super_Fl_Group).super_Fl_Widget.flags_ & 2) == 0);
  }
  Fl_Preferences::set(&FStack_28,"visible",value);
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&FStack_28);
  return;
}

Assistant:

void save_position(Fl_Window *w, const char *prefsName) {
  Fl_Preferences pos(fluid_prefs, prefsName);
  pos.set("x", w->x());
  pos.set("y", w->y());
  pos.set("w", w->w());
  pos.set("h", w->h());
  pos.set("visible", (int)(w->shown() && w->visible()));
}